

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diagnostics.h
# Opt level: O3

void __thiscall
flow::diagnostics::Report::typeError<flow::Signature>
          (Report *this,SourceLocation *sloc,string *f,Signature *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  basic_string_view<char> format_str;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_00;
  string local_2b0;
  SourceLocation local_290;
  Signature *local_258;
  code *local_250;
  undefined **local_248;
  undefined1 *local_240;
  long local_238;
  ulong local_230;
  undefined1 local_228 [504];
  
  paVar1 = &local_290.filename.field_2;
  pcVar2 = (sloc->filename)._M_dataplus._M_p;
  local_290.filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_290,pcVar2,pcVar2 + (sloc->filename)._M_string_length);
  local_290.end.column = (sloc->end).column;
  local_290.end.offset = (sloc->end).offset;
  local_290.begin.line = (sloc->begin).line;
  local_290.begin.column = (sloc->begin).column;
  local_290._40_8_ = *(undefined8 *)&(sloc->begin).offset;
  format_str.data_ = (f->_M_dataplus)._M_p;
  format_str.size_ = f->_M_string_length;
  local_250 = fmt::v5::internal::
              value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
              ::format_custom_arg<flow::Signature>;
  local_238 = 0;
  local_248 = &PTR_grow_001ade08;
  local_230 = 500;
  args_00.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_258;
  args_00.types_ = 0xd;
  local_258 = args;
  local_240 = local_228;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_248,format_str,args_00);
  local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2b0,local_240,local_240 + local_238);
  local_248 = &PTR_grow_001ade08;
  if (local_240 != local_228) {
    operator_delete(local_240,local_230);
  }
  emplace_back(this,TypeError,&local_290,&local_2b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290.filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_290.filename._M_dataplus._M_p,
                    local_290.filename.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void typeError(const SourceLocation& sloc, const std::string& f, Args... args) {
    emplace_back(Type::TypeError, sloc, fmt::format(f, std::move(args)...));
  }